

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayView.hpp
# Opt level: O3

void mserialize::detail::BuiltinSerializer<binlog::ArrayView<int>,_void>::
     serialize<binlog::detail::QueueWriter>(ArrayView<int> *s,QueueWriter *ostream)

{
  int *piVar1;
  int *piVar2;
  int *elem;
  int *piVar3;
  
  *(int *)ostream->_writePos = (int)((ulong)((long)s->_end - (long)s->_begin) >> 2);
  piVar2 = (int *)(ostream->_writePos + 4);
  ostream->_writePos = (char *)piVar2;
  piVar1 = s->_end;
  for (piVar3 = s->_begin; piVar3 != piVar1; piVar3 = piVar3 + 1) {
    *piVar2 = *piVar3;
    piVar2 = (int *)(ostream->_writePos + 4);
    ostream->_writePos = (char *)piVar2;
  }
  return;
}

Assistant:

const T* end()   const { return _end;   }